

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseDispatch<int>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>,std::function<int(double_const&)>,double_const&>
               (QPromiseResolve<int> *resolve,QPromiseReject<int> *reject,
               function<int_(const_double_&)> *fn,double *args)

{
  int local_14;
  
  local_14 = std::function<int_(const_double_&)>::operator()(fn,args);
  PromiseResolver<int>::resolve<int>(&resolve->m_resolver,&local_14);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }